

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProtoHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  string local_c0;
  FileDescriptor *local_a0;
  FileDescriptor *dep;
  undefined1 local_90 [4];
  int i;
  undefined4 local_5c;
  undefined1 local_58 [8];
  Formatter format;
  string *info_path_local;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)info_path;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  if (((this->options_).proto_h & 1U) == 0) {
    local_5c = 1;
  }
  else {
    GenerateTopHeaderGuard(this,printer,false);
    if (((this->options_).opensource_runtime & 1U) == 0) {
      Formatter::operator()<>
                ((Formatter *)local_58,
                 "#ifdef SWIG\n#error \"Do not SWIG-wrap protobufs.\"\n#endif  // SWIG\n\n");
    }
    bVar2 = IsBootstrapProto(&this->options_,this->file_);
    if (bVar2) {
      psVar4 = FileDescriptor::name_abi_cxx11_(this->file_);
      StripProto((string *)local_90,psVar4);
      Formatter::operator()
                ((Formatter *)local_58,"// IWYU pragma: private, include \"$1$.proto.h\"\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
    GenerateLibraryIncludes(this,printer);
    for (dep._4_4_ = 0; iVar1 = dep._4_4_,
        iVar3 = FileDescriptor::public_dependency_count(this->file_), iVar1 < iVar3;
        dep._4_4_ = dep._4_4_ + 1) {
      local_a0 = FileDescriptor::public_dependency(this->file_,dep._4_4_);
      psVar4 = FileDescriptor::name_abi_cxx11_(local_a0);
      StripProto(&local_c0,psVar4);
      Formatter::operator()((Formatter *)local_58,"#include \"$1$.proto.h\"\n",&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    Formatter::operator()<>((Formatter *)local_58,"// @@protoc_insertion_point(includes)\n");
    GenerateMetadataPragma
              (this,printer,(string *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    GenerateHeader(this,printer);
    GenerateBottomHeaderGuard(this,printer,false);
    local_5c = 0;
  }
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void FileGenerator::GenerateProtoHeader(io::Printer* printer,
                                        const std::string& info_path) {
  Formatter format(printer, variables_);
  if (!options_.proto_h) {
    return;
  }

  GenerateTopHeaderGuard(printer, false);

  if (!options_.opensource_runtime) {
    format(
        "#ifdef SWIG\n"
        "#error \"Do not SWIG-wrap protobufs.\"\n"
        "#endif  // SWIG\n"
        "\n");
  }

  if (IsBootstrapProto(options_, file_)) {
    format("// IWYU pragma: private, include \"$1$.proto.h\"\n\n",
           StripProto(file_->name()));
  }

  GenerateLibraryIncludes(printer);

  for (int i = 0; i < file_->public_dependency_count(); i++) {
    const FileDescriptor* dep = file_->public_dependency(i);
    format("#include \"$1$.proto.h\"\n", StripProto(dep->name()));
  }

  format("// @@protoc_insertion_point(includes)\n");

  GenerateMetadataPragma(printer, info_path);

  GenerateHeader(printer);

  GenerateBottomHeaderGuard(printer, false);
}